

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O2

void readExtra(File *f,int exLen,int *uid,int *gid,int64_t *compSize,int64_t *uncompSize)

{
  short sStack_1006c;
  ushort uStack_1006a;
  undefined2 uStack_10068;
  undefined1 auStack_10066 [2];
  Extra extra;
  string link;
  
  link.field_2._8_8_ = gid;
  while (0 < exLen) {
    File::Read<unsigned_char>(f,(uchar *)&sStack_1006c,4);
    File::Read<unsigned_char>(f,(uchar *)&uStack_10068,(ulong)uStack_1006a);
    exLen = (exLen - (uint)uStack_1006a) + -4;
    if (sStack_1006c == 1) {
      if (compSize != (int64_t *)0x0) {
        *compSize = CONCAT53(extra.field_2.zip64.uncompSize._3_5_,extra.field_2.unix.Atime._0_3_);
      }
      if (uncompSize != (int64_t *)0x0) {
        *uncompSize = CONCAT17(extra.size._1_1_,
                               CONCAT16((undefined1)extra.size,CONCAT42(_auStack_10066,uStack_10068)
                                       ));
      }
    }
    else if (sStack_1006c == 0xd) {
      unique0x00004780 = &link._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(extra.field_2.data + 0xfff8),(undefined1 *)((long)&extra.field_2 + 4),
                 auStack_10066 + ((ulong)uStack_1006a - 2));
      std::__cxx11::string::~string((string *)(extra.field_2.data + 0xfff8));
    }
    else if (sStack_1006c == 0x7875) {
      *uid = _auStack_10066;
      *(undefined4 *)link.field_2._8_8_ = extra._3_4_;
    }
  }
  return;
}

Assistant:

static void readExtra(File& f, int exLen, int* uid, int* gid,
                      int64_t* compSize = nullptr,
                      int64_t* uncompSize = nullptr)
{
    Extra extra;
    while (exLen > 0) {
        f.Read((uint8_t*)&extra, 4);
        f.Read(extra.data, extra.size);
        exLen -= (extra.size + 4);
        // printf("EXTRA %x\n", extra.id);
        if (extra.id == 0x7875) {

            *uid = extra.unix2.UID;
            *gid = extra.unix2.GID;
        } else if (extra.id == 0x01) {
            if (compSize)
                *compSize = extra.zip64.compSize;
            if (uncompSize)
                *uncompSize = extra.zip64.uncompSize;
        } else if (extra.id == 0xd) {
            std::string link((char*)extra.unix.var, extra.size - 12);
            // printf("LINK:%s\n", link.c_str());
        }
    }
}